

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::ktx_texture::write_to_stream
          (ktx_texture *this,data_stream_serializer *serializer,bool no_keyvalue_data)

{
  bool bVar1;
  uint uVar2;
  uint32 uVar3;
  uint uVar4;
  uint uVar5;
  int __fd;
  uint uVar6;
  vector<unsigned_char> *pvVar7;
  ssize_t sVar8;
  vector<unsigned_char> *this_00;
  uchar *puVar9;
  byte in_DL;
  vector<unsigned_char> *in_RSI;
  ktx_texture *in_RDI;
  uint num_mip_pad_bytes;
  uint8_vec tmp_image_data_1;
  uint8_vec *image_data_1;
  uint zslice;
  uint face_1;
  uint array_element;
  uint num_cube_pad_bytes;
  uint8_vec tmp_image_data;
  uint8_vec *image_data;
  uint face;
  uint total_mip_size;
  uint32 image_size;
  uint mip_col_blocks;
  uint mip_row_blocks;
  uint mip_depth;
  uint mip_height;
  uint mip_width;
  uint mip_level;
  uint num_padding;
  uint32 key_value_size;
  uint i_1;
  uint8 padding [3];
  uint total_key_value_bytes;
  bool success;
  uint i;
  vector<unsigned_char> *in_stack_fffffffffffffe88;
  ktx_texture *in_stack_fffffffffffffe90;
  vector<unsigned_char> *in_stack_fffffffffffffea0;
  uint *in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb4;
  vector<unsigned_char> *in_stack_fffffffffffffeb8;
  ktx_texture *in_stack_fffffffffffffec0;
  ktx_texture *in_stack_fffffffffffffed8;
  vector<unsigned_char> local_c0;
  vector<unsigned_char> *local_b0;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  vector<unsigned_char> local_88;
  vector<unsigned_char> *local_78;
  uint local_6c;
  int local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  int local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  undefined1 local_3b [3];
  int local_38;
  byte local_31;
  uint local_30;
  byte local_29;
  vector<unsigned_char> *local_28;
  byte local_11;
  uint local_10;
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_29 = in_DL & 1;
  local_28 = in_RSI;
  bVar1 = consistency_check(in_stack_fffffffffffffed8);
  if (bVar1) {
    (in_RDI->m_header).m_identifier[0] = 0xab;
    (in_RDI->m_header).m_identifier[1] = 'K';
    (in_RDI->m_header).m_identifier[2] = 'T';
    (in_RDI->m_header).m_identifier[3] = 'X';
    (in_RDI->m_header).m_identifier[4] = ' ';
    (in_RDI->m_header).m_identifier[5] = '1';
    (in_RDI->m_header).m_identifier[6] = '1';
    (in_RDI->m_header).m_identifier[7] = 0xbb;
    (in_RDI->m_header).m_identifier[8] = '\r';
    (in_RDI->m_header).m_identifier[9] = '\n';
    (in_RDI->m_header).m_identifier[10] = '\x1a';
    (in_RDI->m_header).m_identifier[0xb] = '\n';
    uVar3 = 0x4030201;
    if ((in_RDI->m_opposite_endianness & 1U) != 0) {
      uVar3 = 0x1020304;
    }
    (in_RDI->m_header).m_endianness = uVar3;
    if (in_RDI->m_block_dim == 1) {
      uVar2 = get_ogl_type_size((in_RDI->m_header).m_glType);
      (in_RDI->m_header).m_glTypeSize = uVar2;
      (in_RDI->m_header).m_glBaseInternalFormat = (in_RDI->m_header).m_glFormat;
    }
    else {
      uVar3 = get_ogl_base_internal_fmt((in_RDI->m_header).m_glInternalFormat);
      (in_RDI->m_header).m_glBaseInternalFormat = uVar3;
    }
    (in_RDI->m_header).m_bytesOfKeyValueData = 0;
    if ((local_29 & 1) == 0) {
      for (local_30 = 0; uVar6 = local_30,
          uVar2 = vector<crnlib::vector<unsigned_char>_>::size(&in_RDI->m_key_values), uVar6 < uVar2
          ; local_30 = local_30 + 1) {
        pvVar7 = vector<crnlib::vector<unsigned_char>_>::operator[](&in_RDI->m_key_values,local_30);
        uVar2 = vector<unsigned_char>::size(pvVar7);
        (in_RDI->m_header).m_bytesOfKeyValueData =
             (in_RDI->m_header).m_bytesOfKeyValueData + (uVar2 + 3 & 0xfffffffc) + 4;
      }
    }
    if ((in_RDI->m_opposite_endianness & 1U) != 0) {
      ktx_header::endian_swap((ktx_header *)0x224548);
    }
    sVar8 = data_stream_serializer::write
                      ((data_stream_serializer *)local_28,(int)in_RDI,(void *)0x40,1);
    local_31 = (int)sVar8 == 1;
    if ((in_RDI->m_opposite_endianness & 1U) != 0) {
      ktx_header::endian_swap((ktx_header *)0x224594);
    }
    if ((local_31 & 1) == 0) {
      local_11 = local_31 & 1;
    }
    else {
      local_38 = 0;
      memset(local_3b,0,3);
      if ((local_29 & 1) == 0) {
        for (local_40 = 0; uVar6 = local_40,
            uVar2 = vector<crnlib::vector<unsigned_char>_>::size(&in_RDI->m_key_values),
            uVar6 < uVar2; local_40 = local_40 + 1) {
          pvVar7 = vector<crnlib::vector<unsigned_char>_>::operator[]
                             (&in_RDI->m_key_values,local_40);
          uVar2 = vector<unsigned_char>::size(pvVar7);
          local_44 = uVar2;
          if ((in_RDI->m_opposite_endianness & 1U) != 0) {
            local_44 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18;
            local_4 = uVar2;
          }
          sVar8 = data_stream_serializer::write
                            ((data_stream_serializer *)local_28,(int)&local_44,(void *)0x4,1);
          pvVar7 = local_28;
          local_31 = (int)sVar8 == 1;
          local_38 = local_38 + 4;
          if ((in_RDI->m_opposite_endianness & 1U) != 0) {
            local_8 = local_44;
            local_44 = local_44 >> 0x18 | (local_44 & 0xff0000) >> 8 | (local_44 & 0xff00) << 8 |
                       local_44 << 0x18;
          }
          if (!(bool)local_31) {
            local_11 = 0;
            goto LAB_0022505b;
          }
          if (local_44 != 0) {
            this_00 = vector<crnlib::vector<unsigned_char>_>::operator[]
                                (&in_RDI->m_key_values,local_40);
            puVar9 = vector<unsigned_char>::operator[](this_00,0);
            sVar8 = data_stream_serializer::write
                              ((data_stream_serializer *)pvVar7,(int)puVar9,(void *)(ulong)local_44,
                               1);
            if ((int)sVar8 != 1) {
              local_11 = 0;
              goto LAB_0022505b;
            }
            local_38 = local_44 + local_38;
            local_48 = 3 - (local_44 + 3 & 3);
            if ((local_48 != 0) &&
               (sVar8 = data_stream_serializer::write
                                  ((data_stream_serializer *)local_28,(int)local_3b,
                                   (void *)(ulong)local_48,1), (int)sVar8 != 1)) {
              local_11 = 0;
              goto LAB_0022505b;
            }
            local_38 = local_48 + local_38;
          }
        }
      }
      for (local_4c = 0; uVar6 = local_4c, uVar2 = get_num_mips(in_RDI), uVar6 < uVar2;
          local_4c = local_4c + 1) {
        get_mip_dim(in_stack_fffffffffffffec0,(uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                    (uint *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                    in_stack_fffffffffffffea8,(uint *)in_stack_fffffffffffffea0);
        local_5c = ((local_50 + in_RDI->m_block_dim) - 1) / in_RDI->m_block_dim;
        local_60 = ((local_54 + in_RDI->m_block_dim) - 1) / in_RDI->m_block_dim;
        if ((local_5c == 0) || (local_60 == 0)) {
          local_11 = 0;
          goto LAB_0022505b;
        }
        local_64 = local_5c * local_60 * in_RDI->m_bytes_per_block;
        if (((in_RDI->m_header).m_numberOfArrayElements != 0) ||
           (uVar2 = get_num_faces(in_RDI), uVar2 == 1)) {
          uVar2 = get_array_size(in_RDI);
          uVar4 = get_num_faces(in_RDI);
          uVar5 = get_depth(in_RDI);
          local_64 = uVar2 * uVar4 * uVar5 * local_64;
        }
        if (local_64 == 0) {
          local_11 = 0;
          goto LAB_0022505b;
        }
        if ((in_RDI->m_opposite_endianness & 1U) != 0) {
          local_c = local_64;
          local_64 = local_64 >> 0x18 | (local_64 & 0xff0000) >> 8 | (local_64 & 0xff00) << 8 |
                     local_64 << 0x18;
        }
        sVar8 = data_stream_serializer::write
                          ((data_stream_serializer *)local_28,(int)&local_64,(void *)0x4,1);
        local_31 = (int)sVar8 == 1;
        if ((in_RDI->m_opposite_endianness & 1U) != 0) {
          local_10 = local_64;
          local_64 = local_64 >> 0x18 | (local_64 & 0xff0000) >> 8 | (local_64 & 0xff00) << 8 |
                     local_64 << 0x18;
        }
        if (!(bool)local_31) {
          local_11 = 0;
          goto LAB_0022505b;
        }
        local_68 = 0;
        if (((in_RDI->m_header).m_numberOfArrayElements == 0) &&
           (uVar2 = get_num_faces(in_RDI), uVar2 == 6)) {
          for (local_6c = 0; uVar6 = local_6c, uVar2 = get_num_faces(in_RDI), uVar6 < uVar2;
              local_6c = local_6c + 1) {
            get_image_index(in_stack_fffffffffffffec0,
                            (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                            (uint)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                            in_stack_fffffffffffffeb0);
            local_78 = get_image_data(in_stack_fffffffffffffe90,
                                      (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20));
            uVar2 = vector<unsigned_char>::size(local_78);
            if ((uVar2 == 0) ||
               (uVar2 = vector<unsigned_char>::size(local_78), pvVar7 = local_28, uVar2 != local_64)
               ) {
              local_11 = 0;
              goto LAB_0022505b;
            }
            if ((in_RDI->m_opposite_endianness & 1U) == 0) {
              puVar9 = vector<unsigned_char>::operator[](local_78,0);
              __fd = (int)puVar9;
              uVar2 = vector<unsigned_char>::size(local_78);
              sVar8 = data_stream_serializer::write
                                ((data_stream_serializer *)pvVar7,__fd,(void *)(ulong)uVar2,1);
              if ((int)sVar8 != 1) {
                local_11 = 0;
                goto LAB_0022505b;
              }
            }
            else {
              vector<unsigned_char>::vector
                        ((vector<unsigned_char> *)in_stack_fffffffffffffe90,
                         in_stack_fffffffffffffe88);
              vector<unsigned_char>::operator[](&local_88,0);
              vector<unsigned_char>::size(&local_88);
              utils::endian_swap_mem
                        (in_stack_fffffffffffffe90,(uint)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                         (uint)in_stack_fffffffffffffe88);
              pvVar7 = local_28;
              puVar9 = vector<unsigned_char>::operator[](&local_88,0);
              uVar2 = vector<unsigned_char>::size(&local_88);
              sVar8 = data_stream_serializer::write
                                ((data_stream_serializer *)pvVar7,(int)puVar9,(void *)(ulong)uVar2,1
                                );
              bVar1 = (int)sVar8 != 1;
              if (bVar1) {
                local_11 = 0;
              }
              local_98 = (uint)bVar1;
              vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_fffffffffffffe90);
              if (local_98 != 0) goto LAB_0022505b;
            }
            uVar2 = vector<unsigned_char>::size(local_78);
            local_9c = 3 - (uVar2 + 3 & 3);
            if ((local_9c != 0) &&
               (sVar8 = data_stream_serializer::write
                                  ((data_stream_serializer *)local_28,(int)local_3b,
                                   (void *)(ulong)local_9c,1), (int)sVar8 != 1)) {
              local_11 = 0;
              goto LAB_0022505b;
            }
            local_68 = local_64 + local_9c + local_68;
          }
        }
        else {
          for (local_a0 = 0; uVar6 = local_a0, uVar2 = get_array_size(in_RDI), uVar6 < uVar2;
              local_a0 = local_a0 + 1) {
            for (local_a4 = 0; uVar6 = local_a4, uVar2 = get_num_faces(in_RDI), uVar6 < uVar2;
                local_a4 = local_a4 + 1) {
              for (local_a8 = 0; local_a8 < local_58; local_a8 = local_a8 + 1) {
                get_image_index(in_stack_fffffffffffffec0,
                                (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                                (uint)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                                in_stack_fffffffffffffeb0);
                local_b0 = get_image_data(in_stack_fffffffffffffe90,
                                          (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20));
                uVar2 = vector<unsigned_char>::size(local_b0);
                if (uVar2 == 0) {
                  local_11 = 0;
                  goto LAB_0022505b;
                }
                if ((in_RDI->m_opposite_endianness & 1U) == 0) {
                  in_stack_fffffffffffffe88 = local_28;
                  in_stack_fffffffffffffe90 =
                       (ktx_texture *)vector<unsigned_char>::operator[](local_b0,0);
                  uVar2 = vector<unsigned_char>::size(local_b0);
                  sVar8 = data_stream_serializer::write
                                    ((data_stream_serializer *)in_stack_fffffffffffffe88,
                                     (int)in_stack_fffffffffffffe90,(void *)(ulong)uVar2,1);
                  if ((int)sVar8 != 1) {
                    local_11 = 0;
                    goto LAB_0022505b;
                  }
                }
                else {
                  in_stack_fffffffffffffeb8 = &local_c0;
                  vector<unsigned_char>::vector
                            ((vector<unsigned_char> *)in_stack_fffffffffffffe90,
                             in_stack_fffffffffffffe88);
                  in_stack_fffffffffffffec0 =
                       (ktx_texture *)vector<unsigned_char>::operator[](in_stack_fffffffffffffeb8,0)
                  ;
                  in_stack_fffffffffffffeb4 = vector<unsigned_char>::size(&local_c0);
                  utils::endian_swap_mem
                            (in_stack_fffffffffffffe90,
                             (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                             (uint)in_stack_fffffffffffffe88);
                  in_stack_fffffffffffffea0 = local_28;
                  in_stack_fffffffffffffea8 = (uint *)vector<unsigned_char>::operator[](&local_c0,0)
                  ;
                  uVar2 = vector<unsigned_char>::size(&local_c0);
                  sVar8 = data_stream_serializer::write
                                    ((data_stream_serializer *)in_stack_fffffffffffffea0,
                                     (int)in_stack_fffffffffffffea8,(void *)(ulong)uVar2,1);
                  bVar1 = (int)sVar8 != 1;
                  if (bVar1) {
                    local_11 = 0;
                  }
                  local_98 = (uint)bVar1;
                  vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_fffffffffffffe90)
                  ;
                  if (local_98 != 0) goto LAB_0022505b;
                }
                uVar2 = vector<unsigned_char>::size(local_b0);
                local_68 = uVar2 + local_68;
              }
            }
          }
          uVar6 = 3 - (local_68 + 3U & 3);
          if ((uVar6 != 0) &&
             (sVar8 = data_stream_serializer::write
                                ((data_stream_serializer *)local_28,(int)local_3b,
                                 (void *)(ulong)uVar6,1), (int)sVar8 != 1)) {
            local_11 = 0;
            goto LAB_0022505b;
          }
          local_68 = uVar6 + local_68;
        }
      }
      local_11 = 1;
    }
  }
  else {
    local_11 = 0;
  }
LAB_0022505b:
  return (bool)(local_11 & 1);
}

Assistant:

bool ktx_texture::write_to_stream(data_stream_serializer& serializer, bool no_keyvalue_data) {
  if (!consistency_check()) {
    CRNLIB_ASSERT(0);
    return false;
  }

  memcpy(m_header.m_identifier, s_ktx_file_id, sizeof(m_header.m_identifier));
  m_header.m_endianness = m_opposite_endianness ? KTX_OPPOSITE_ENDIAN : KTX_ENDIAN;

  if (m_block_dim == 1) {
    m_header.m_glTypeSize = get_ogl_type_size(m_header.m_glType);
    m_header.m_glBaseInternalFormat = m_header.m_glFormat;
  } else {
    m_header.m_glBaseInternalFormat = get_ogl_base_internal_fmt(m_header.m_glInternalFormat);
  }

  m_header.m_bytesOfKeyValueData = 0;
  if (!no_keyvalue_data) {
    for (uint i = 0; i < m_key_values.size(); i++)
      m_header.m_bytesOfKeyValueData += sizeof(uint32) + ((m_key_values[i].size() + 3) & ~3);
  }

  if (m_opposite_endianness)
    m_header.endian_swap();

  bool success = (serializer.write(&m_header, sizeof(m_header), 1) == 1);

  if (m_opposite_endianness)
    m_header.endian_swap();

  if (!success)
    return success;

  uint total_key_value_bytes = 0;
  const uint8 padding[3] = {0, 0, 0};

  if (!no_keyvalue_data) {
    for (uint i = 0; i < m_key_values.size(); i++) {
      uint32 key_value_size = m_key_values[i].size();

      if (m_opposite_endianness)
        key_value_size = utils::swap32(key_value_size);

      success = (serializer.write(&key_value_size, sizeof(key_value_size), 1) == 1);
      total_key_value_bytes += sizeof(key_value_size);

      if (m_opposite_endianness)
        key_value_size = utils::swap32(key_value_size);

      if (!success)
        return false;

      if (key_value_size) {
        if (serializer.write(&m_key_values[i][0], key_value_size, 1) != 1)
          return false;
        total_key_value_bytes += key_value_size;

        uint num_padding = 3 - ((key_value_size + 3) % 4);
        if ((num_padding) && (serializer.write(padding, num_padding, 1) != 1))
          return false;
        total_key_value_bytes += num_padding;
      }
    }
    (void)total_key_value_bytes;
  }

  CRNLIB_ASSERT(total_key_value_bytes == m_header.m_bytesOfKeyValueData);

  for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++) {
    uint mip_width, mip_height, mip_depth;
    get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

    const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
    const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
    if ((!mip_row_blocks) || (!mip_col_blocks))
      return false;

    uint32 image_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
    if ((m_header.m_numberOfArrayElements) || (get_num_faces() == 1))
      image_size *= (get_array_size() * get_num_faces() * get_depth());

    if (!image_size)
      return false;

    if (m_opposite_endianness)
      image_size = utils::swap32(image_size);

    success = (serializer.write(&image_size, sizeof(image_size), 1) == 1);

    if (m_opposite_endianness)
      image_size = utils::swap32(image_size);

    if (!success)
      return false;

    uint total_mip_size = 0;

    if ((!m_header.m_numberOfArrayElements) && (get_num_faces() == 6)) {
      // plain non-array cubemap
      for (uint face = 0; face < get_num_faces(); face++) {
        const uint8_vec& image_data = get_image_data(get_image_index(mip_level, 0, face, 0));
        if ((!image_data.size()) || (image_data.size() != image_size))
          return false;

        if (m_opposite_endianness) {
          uint8_vec tmp_image_data(image_data);
          utils::endian_swap_mem(&tmp_image_data[0], tmp_image_data.size(), m_header.m_glTypeSize);
          if (serializer.write(&tmp_image_data[0], tmp_image_data.size(), 1) != 1)
            return false;
        } else if (serializer.write(&image_data[0], image_data.size(), 1) != 1)
          return false;

        uint num_cube_pad_bytes = 3 - ((image_data.size() + 3) % 4);
        if ((num_cube_pad_bytes) && (serializer.write(padding, num_cube_pad_bytes, 1) != 1))
          return false;

        total_mip_size += image_size + num_cube_pad_bytes;
      }
    } else {
      // 1D, 2D, 3D (normal or array texture), or array cubemap
      for (uint array_element = 0; array_element < get_array_size(); array_element++) {
        for (uint face = 0; face < get_num_faces(); face++) {
          for (uint zslice = 0; zslice < mip_depth; zslice++) {
            const uint8_vec& image_data = get_image_data(get_image_index(mip_level, array_element, face, zslice));
            if (!image_data.size())
              return false;

            if (m_opposite_endianness) {
              uint8_vec tmp_image_data(image_data);
              utils::endian_swap_mem(&tmp_image_data[0], tmp_image_data.size(), m_header.m_glTypeSize);
              if (serializer.write(&tmp_image_data[0], tmp_image_data.size(), 1) != 1)
                return false;
            } else if (serializer.write(&image_data[0], image_data.size(), 1) != 1)
              return false;

            total_mip_size += image_data.size();
          }
        }
      }

      uint num_mip_pad_bytes = 3 - ((total_mip_size + 3) % 4);
      if ((num_mip_pad_bytes) && (serializer.write(padding, num_mip_pad_bytes, 1) != 1))
        return false;
      total_mip_size += num_mip_pad_bytes;
    }
    CRNLIB_ASSERT((total_mip_size & 3) == 0);
  }

  return true;
}